

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O1

MouseEventResult __thiscall
QMenuSloppyState::processMouseEvent
          (QMenuSloppyState *this,QPointF *mousePos,QAction *resetAction,QAction *currentAction)

{
  long lVar1;
  QAction **ppQVar2;
  long *plVar3;
  double dVar4;
  Data *pDVar5;
  qreal qVar6;
  qreal qVar7;
  char cVar8;
  LayoutDirection LVar9;
  int iVar10;
  QList<QAction_*> *pQVar11;
  short sVar12;
  QAction **extraout_RDX;
  QAction **ppQVar13;
  MouseEventResult MVar14;
  long lVar15;
  QAction **ppQVar16;
  long in_FS_OFFSET;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  double dVar22;
  uint uVar24;
  double dVar25;
  undefined1 auVar23 [16];
  double dVar26;
  double dVar27;
  double dVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  QList<QAction_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_parent != (QMenuSloppyState *)0x0) {
    QBasicTimer::stop();
  }
  MVar14 = EventShouldBePropagated;
  if ((this->field_0x6c & 1) == 0) goto LAB_00468c65;
  startTimerIfNotRunning(this);
  pDVar5 = (this->m_sub_menu).wp.d;
  if (((pDVar5 == (Data *)0x0) || (*(int *)(pDVar5 + 4) == 0)) ||
     ((this->m_sub_menu).wp.value == (QObject *)0x0)) {
    reset(this);
    goto LAB_00468c65;
  }
  qVar6 = mousePos->xp;
  qVar7 = mousePos->yp;
  if (resetAction == (QAction *)0x0) {
LAB_00468ae9:
    if (this->m_reset_action != resetAction) {
      if ((resetAction != (QAction *)0x0) && ((this->field_0x6c & 0x20) != 0)) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
        pQVar11 = QWidget::actions(&local_58,&this->m_menu->super_QWidget);
        ppQVar13 = extraout_RDX;
        if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_00468b75:
          uVar21 = 0xffffffff;
        }
        else {
          lVar15 = -8;
          do {
            uVar21 = (uint)pQVar11;
            lVar1 = local_58.d.size * -8 + lVar15;
            if (lVar1 == -8) goto LAB_00468b6f;
            pQVar11 = (QList<QAction_*> *)(lVar15 + 8);
            plVar3 = (long *)((long)(local_58.d.ptr + 1) + lVar15);
            lVar15 = (long)pQVar11;
          } while ((QAction *)*plVar3 != resetAction);
          uVar21 = (uint)((long)pQVar11 >> 3);
LAB_00468b6f:
          ppQVar13 = local_58.d.ptr;
          if (lVar1 == -8) goto LAB_00468b75;
        }
        if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_00468bba:
          uVar24 = 0xffffffff;
        }
        else {
          ppQVar16 = (QAction **)0xfffffffffffffff8;
          do {
            uVar24 = (uint)ppQVar13;
            ppQVar2 = ppQVar16 + -local_58.d.size;
            if (ppQVar2 == (QAction **)0xfffffffffffffff8) goto LAB_00468bb4;
            ppQVar13 = ppQVar16 + 1;
            plVar3 = (long *)((long)(local_58.d.ptr + 1) + (long)ppQVar16);
            ppQVar16 = ppQVar13;
          } while ((QAction *)*plVar3 != this->m_origin_action);
          uVar24 = (uint)((long)ppQVar13 >> 3);
LAB_00468bb4:
          if (ppQVar2 == (QAction **)0xfffffffffffffff8) goto LAB_00468bba;
        }
        if (-1 < (int)(uVar24 | uVar21)) {
          uVar21 = uVar21 - uVar24;
          uVar24 = -uVar21;
          if (0 < (int)uVar21) {
            uVar24 = uVar21;
          }
          if (1 < uVar24) {
            this->field_0x6c = this->field_0x6c & 0xdf;
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
          }
        }
      }
      this->m_reset_action = resetAction;
    }
  }
  else {
    cVar8 = QAction::isSeparator();
    if (cVar8 == '\0') goto LAB_00468ae9;
    this->m_reset_action = (QAction *)0x0;
    this->field_0x6c = this->field_0x6c | 0x20;
  }
  cVar8 = QRectF::contains((QPointF *)&this->m_action_rect);
  if (cVar8 == '\0') {
    if ((((this->field_0x6c & 2) != 0) && (this->m_first_mouse == false)) &&
       (this->m_origin_action != resetAction)) {
      LVar9 = QWidget::layoutDirection(&this->m_menu->super_QWidget);
      lVar15 = *(long *)((this->m_sub_menu).wp.value + 0x20);
      dVar26 = (this->m_previous_point).yp;
      dVar4 = mousePos->yp;
      iVar10 = (int)(dVar26 - dVar4);
      dVar34 = (this->m_previous_point).xp;
      uVar21 = (int)((uint)(LVar9 == LeftToRight) << 0x1f) >> 0x1f;
      uVar24 = (int)((uint)(LVar9 == LeftToRight) << 0x1f) >> 0x1f;
      dVar27 = (double)(int)(*(uint *)(lVar15 + 0x1c) & ~uVar21 | *(uint *)(lVar15 + 0x14) & uVar21)
      ;
      dVar30 = (double)(int)(*(uint *)(lVar15 + 0x1c) & ~uVar24 | *(uint *)(lVar15 + 0x14) & uVar24)
      ;
      dVar22 = (double)*(int *)(lVar15 + 0x18);
      dVar25 = (double)*(int *)(lVar15 + 0x20);
      dVar33 = dVar27 - dVar34;
      dVar34 = dVar30 - dVar34;
      auVar35._0_8_ = dVar22 - dVar26;
      auVar35._8_8_ = dVar25 - dVar26;
      uVar17 = -(ulong)(dVar33 < -dVar33);
      uVar18 = -(ulong)(dVar34 < -dVar34);
      uVar17 = -(ulong)((double)(~uVar17 & (ulong)dVar33 | (ulong)-dVar33 & uVar17) <= 1e-12);
      uVar18 = -(ulong)((double)(~uVar18 & (ulong)dVar34 | (ulong)-dVar34 & uVar18) <= 1e-12);
      auVar36._8_8_ = dVar34;
      auVar36._0_8_ = dVar33;
      auVar36 = divpd(auVar35,auVar36);
      dVar33 = (double)(~uVar17 & auVar36._0_8_ | uVar17 & 0x40c3878000000000);
      dVar31 = (double)(~uVar18 & auVar36._8_8_ | uVar18 & 0x40c3878000000000);
      auVar28._0_8_ = dVar27 - mousePos->xp;
      auVar28._8_8_ = dVar30 - mousePos->xp;
      auVar32._0_8_ = dVar22 - dVar4;
      auVar32._8_8_ = dVar25 - dVar4;
      uVar17 = -(ulong)(auVar28._0_8_ < -auVar28._0_8_);
      uVar18 = -(ulong)(auVar28._8_8_ < -auVar28._8_8_);
      uVar17 = -(ulong)((double)(~uVar17 & (ulong)auVar28._0_8_ | (ulong)-auVar28._0_8_ & uVar17) <=
                       1e-12);
      uVar18 = -(ulong)((double)(~uVar18 & (ulong)auVar28._8_8_ | (ulong)-auVar28._8_8_ & uVar18) <=
                       1e-12);
      auVar36 = divpd(auVar32,auVar28);
      dVar26 = (double)(~uVar17 & auVar36._0_8_ | uVar17 & 0x40c3878000000000);
      dVar34 = (double)(~uVar18 & auVar36._8_8_ | uVar18 & 0x40c3878000000000);
      auVar29._0_8_ = -(ulong)(dVar33 <= dVar26 && dVar22 < dVar4);
      auVar29._8_8_ = -(ulong)(dVar31 <= dVar34 && dVar4 < dVar25);
      auVar23._0_8_ = ~-(ulong)(dVar22 < dVar4) & -(ulong)(dVar26 <= dVar33);
      auVar23._8_8_ = ~-(ulong)(dVar4 < dVar25) & -(ulong)(dVar34 <= dVar31);
      auVar19._0_4_ = -(uint)(-1 < iVar10);
      auVar19._4_4_ = -(uint)(0 < iVar10);
      auVar19._8_4_ = -(uint)(iVar10 < 1);
      auVar19._12_4_ = 0xffffffff;
      auVar19 = auVar19 & (auVar23 | auVar29);
      auVar20._0_8_ = auVar19._0_8_ << 0x3f;
      auVar20._8_8_ = auVar19._8_8_ << 0x3f;
      iVar10 = movmskpd(iVar10,auVar20);
      if ((this->m_uni_dir_fail_at_count <= this->m_uni_dir_discarded_count) && (iVar10 == 0)) {
        this->m_uni_dir_discarded_count = 0;
        MVar14 = EventDiscardsSloppyState;
        goto LAB_00468c59;
      }
      sVar12 = 0;
      if (iVar10 == 0) {
        sVar12 = this->m_uni_dir_discarded_count + 1;
      }
      this->m_uni_dir_discarded_count = sVar12;
    }
    MVar14 = *(uint *)&this->field_0x6c >> 2 & EventShouldBePropagated;
  }
  else {
    if ((this->field_0x6c & 1) != 0) {
      QBasicTimer::start(&this->m_time,(long)this->m_timeout * 1000000,1,this->m_menu);
    }
    MVar14 = (MouseEventResult)
             (*(QAction **)(*(long *)&(this->m_menu->super_QWidget).field_0x8 + 0x3a8) !=
             currentAction);
  }
LAB_00468c59:
  (this->m_previous_point).xp = qVar6;
  (this->m_previous_point).yp = qVar7;
  this->m_first_mouse = false;
LAB_00468c65:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return MVar14;
  }
  __stack_chk_fail();
}

Assistant:

MouseEventResult processMouseEvent(const QPointF &mousePos, QAction *resetAction, QAction *currentAction)
    {
        if (m_parent)
            m_parent->stopTimer();

        if (!m_enabled)
            return EventShouldBePropagated;

        startTimerIfNotRunning();

        if (!m_sub_menu) {
            reset();
            return EventShouldBePropagated;
        }

        QSetValueOnDestroy<bool> setFirstMouse(m_first_mouse, false);
        QSetValueOnDestroy<QPointF> setPreviousPoint(m_previous_point, mousePos);

        if (resetAction && resetAction->isSeparator()) {
            m_reset_action = nullptr;
            m_use_reset_action = true;
        } else if (m_reset_action != resetAction) {
            if (m_use_reset_action && resetAction) {
                const QList<QAction *> actions = m_menu->actions();
                const int resetIdx  = actions.indexOf(resetAction);
                const int originIdx = actions.indexOf(m_origin_action);
                if (resetIdx > -1 && originIdx > -1 && qAbs(resetIdx - originIdx) > 1)
                    m_use_reset_action = false;
            }
            m_reset_action = resetAction;
        }

        if (m_action_rect.contains(mousePos)) {
            startTimer();
            return currentAction == m_menu->menuAction() ? EventIsProcessed : EventShouldBePropagated;
        }

        if (m_uni_directional && !m_first_mouse && resetAction != m_origin_action) {
            bool left_to_right = m_menu->layoutDirection() == Qt::LeftToRight;
            QRect sub_menu_rect = m_sub_menu->geometry();
            QPoint sub_menu_top =
                    left_to_right? sub_menu_rect.topLeft() : sub_menu_rect.topRight();
            QPoint sub_menu_bottom =
                    left_to_right? sub_menu_rect.bottomLeft() : sub_menu_rect.bottomRight();
            qreal prev_slope_top = slope(m_previous_point, sub_menu_top);
            qreal prev_slope_bottom = slope(m_previous_point, sub_menu_bottom);

            qreal current_slope_top = slope(mousePos, sub_menu_top);
            qreal current_slope_bottom = slope(mousePos, sub_menu_bottom);

            bool slopeTop = checkSlope(prev_slope_top, current_slope_top, sub_menu_top.y() < mousePos.y());
            bool slopeBottom = checkSlope(prev_slope_bottom, current_slope_bottom, sub_menu_bottom.y() > mousePos.y());
            bool rightDirection = false;
            int mouseDir = int(m_previous_point.y() - mousePos.y());
            if (mouseDir >= 0) {
                rightDirection = rightDirection || slopeTop;
            }
            if (mouseDir <= 0) {
                rightDirection = rightDirection || slopeBottom;
            }

            if (m_uni_dir_discarded_count >= m_uni_dir_fail_at_count && !rightDirection) {
                m_uni_dir_discarded_count = 0;
                return EventDiscardsSloppyState;
            }

            if (!rightDirection)
                m_uni_dir_discarded_count++;
            else
                m_uni_dir_discarded_count = 0;

        }

        return m_select_other_actions ? EventShouldBePropagated : EventIsProcessed;
    }